

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O1

void __thiscall
CompressedArray::CompressedArray
          (CompressedArray *this,vector<Record,_std::allocator<Record>_> *sorted_records)

{
  pointer *ppBVar1;
  uint uVar2;
  iterator __position;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  Key KVar5;
  pointer pBVar6;
  pointer pBVar7;
  Key KVar8;
  Key KVar9;
  Key KVar10;
  Key KVar11;
  Key *__x;
  uint32_t uVar12;
  ulong uVar13;
  BlockHeader header;
  undefined1 local_a8 [16];
  Key local_98;
  Key KStack_90;
  Key local_88;
  Key *local_80;
  vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_> local_78;
  Key KStack_60;
  Key local_58;
  vector<Record,_std::allocator<Record>_> local_48;
  
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_dump_00150d38;
  local_80 = (Key *)&this->data;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ngram_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_0014fe10;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->continuations_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_0014fe10;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->unique_continuations_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_0014fe10;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Record,_std::allocator<Record>_>::vector(&local_48,sorted_records);
  store_values(this,&local_48);
  if (local_48.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this->record_count =
       (int)((ulong)((long)(sorted_records->super__Vector_base<Record,_std::allocator<Record>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(sorted_records->super__Vector_base<Record,_std::allocator<Record>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
  find_best_radix_parameters(this,sorted_records);
  if (this->record_count != 0) {
    uVar13 = 0;
    do {
      local_78.
      super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
      ._M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            &(sorted_records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar13].key;
      local_78.
      super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44((*(int *)&(this->data).super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_finish.
                                       super__Bit_iterator_base._M_p -
                             *(int *)&(this->data).super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl.super__Bvector_impl_data._M_start.
                                      super__Bit_iterator_base._M_p) * 8 +
                             (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
                             (uint32_t)uVar13);
      __position._M_current =
           (this->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->headers).
          super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CompressedArray::BlockHeader,std::allocator<CompressedArray::BlockHeader>>::
        _M_realloc_insert<CompressedArray::BlockHeader_const&>
                  ((vector<CompressedArray::BlockHeader,std::allocator<CompressedArray::BlockHeader>>
                    *)&this->headers,__position,(BlockHeader *)&local_78);
      }
      else {
        (__position._M_current)->key =
             (Key)local_78.
                  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)&(__position._M_current)->record_index =
             local_78.
             super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        ppBVar1 = &(this->headers).
                   super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      p_Var3 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      p_Var4 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar2 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      uVar12 = fill_block(this,sorted_records,(uint32_t)uVar13);
      uVar13 = (ulong)uVar12;
      if (0x400 < ((ulong)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset -
                  (ulong)uVar2) +
                  ((long)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
                  ((long)p_Var3 -
                  ((long)p_Var4 +
                  (long)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p))) * 8) {
        __assert_fail("new_size - old_size <= max_block_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/CompressedArray.cpp"
                      ,0x1b,"CompressedArray::CompressedArray(vector<Record>)");
      }
    } while (uVar12 < this->record_count);
  }
  std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::vector
            (&local_78,&this->headers);
  __x = local_80;
  KVar5 = (Key)(this->headers).
               super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pBVar6 = (this->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar7 = (this->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)KVar5;
  local_78.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish = pBVar6;
  local_78.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pBVar7;
  if (KVar5 != (Key)0x0) {
    operator_delete((void *)KVar5);
  }
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_a8,
             (vector<bool,_std::allocator<bool>_> *)__x);
  local_58 = local_88;
  local_78.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98;
  KStack_60 = KStack_90;
  local_78.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
  local_78.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
  KVar5 = __x[4];
  KVar8 = __x[2];
  KVar9 = __x[3];
  KVar10 = *__x;
  KVar11 = __x[1];
  __x->word_index = local_a8._0_4_;
  __x->context_index = local_a8._4_4_;
  __x[1].word_index = local_a8._8_4_;
  __x[1].context_index = local_a8._12_4_;
  __x[2] = local_98;
  __x[3] = KStack_90;
  __x[4] = local_88;
  if (KVar10 != (Key)0x0) {
    local_a8._0_8_ = KVar10;
    local_a8._8_8_ = KVar11;
    local_98 = KVar8;
    KStack_90 = KVar9;
    local_88 = KVar5;
    operator_delete((void *)KVar10);
  }
  return;
}

Assistant:

CompressedArray::CompressedArray(vector<Record> sorted_records) {
    store_values(sorted_records);
    record_count = uint32_t(sorted_records.size());
    find_best_radix_parameters(sorted_records);

    uint32_t record_index = 0;
    while (record_index < record_count) {
        BlockHeader header;
        header.key = sorted_records[record_index].key;
        header.record_index = record_index;
        header.offset = uint32_t(data.size());
        headers.push_back(header);

        size_t old_size = data.size();
        record_index = fill_block(sorted_records, record_index);
        size_t new_size = data.size();
        assert(new_size - old_size <= max_block_size);
    }
    vector<BlockHeader>(headers).swap(headers);
    vector<bool>(data).swap(data);
}